

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall chrono::ChSystem::GetDampingMatrix(ChSystem *this,ChSparseMatrix *R)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  ChAssembly::KRMmatricesLoad(&this->assembly,0.0,1.0,0.0);
  (*(((this->contact_container).
      super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3a])(0,0x3ff0000000000000,0);
  (*((this->descriptor).super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_ChSystemDescriptor[10])(0);
  peVar1 = (this->descriptor).
           super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->descriptor).
            super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_ChSystemDescriptor[0x1b])(peVar1,0,R,0,0,0,0,0,0);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void ChSystem::GetDampingMatrix(ChSparseMatrix* R) {
    // IntToDescriptor(0, Dv, R, 0, L, Qc);
    // ConstraintsLoadJacobians();

    // Load all KRM matrices with the R part only
    this->KRMmatricesLoad(0, 1.0, 0);
    // For ChVariable objects without a ChKblock, but still with a mass:
    descriptor->SetMassFactor(0.0);

    // Fill system-level R matrix
    this->GetSystemDescriptor()->ConvertToMatrixForm(nullptr, R, nullptr, nullptr, nullptr, nullptr, false, false);
}